

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegCompactPushString(xmlRegExecCtxtPtr exec,xmlRegexpPtr comp,xmlChar *value,void *data)

{
  int iVar1;
  int iVar2;
  xmlChar **ppxVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  xmlChar *pxVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  
  uVar4 = 0xffffffff;
  if (((comp != (xmlRegexpPtr)0x0) && (piVar9 = comp->compact, piVar9 != (int *)0x0)) &&
     (ppxVar3 = comp->stringMap, ppxVar3 != (xmlChar **)0x0)) {
    iVar1 = exec->index;
    uVar4 = comp->nbstrings;
    if (value == (xmlChar *)0x0) {
      uVar4 = (uint)(piVar9[(int)((uVar4 + 1) * iVar1)] == 2);
    }
    else {
      iVar5 = uVar4 + 1;
      uVar10 = 0;
      uVar8 = 0;
      if (0 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
      }
      for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        iVar2 = piVar9[(long)(iVar5 * iVar1) + uVar10 + 1];
        if (((0 < iVar2) && (iVar2 <= comp->nbstates)) &&
           (iVar6 = xmlRegStrEqualWildcard(ppxVar3[uVar10],value), iVar6 != 0)) {
          exec->index = iVar2 + -1;
          if ((exec->callback != (xmlRegExecCallbacks)0x0) && (comp->transdata != (void **)0x0)) {
            (*exec->callback)((xmlRegExecCtxtPtr)exec->data,value,
                              comp->transdata[(int)((int)uVar10 + uVar4 * iVar1)],data);
            piVar9 = comp->compact;
            iVar5 = comp->nbstrings + 1;
          }
          if (piVar9[iVar5 * (iVar2 + -1)] == 2) {
            return 1;
          }
          if (piVar9[iVar5 * (iVar2 + -1)] != 4) {
            return 0;
          }
          break;
        }
      }
      if (exec->errString != (xmlChar *)0x0) {
        (*xmlFree)(exec->errString);
      }
      pxVar7 = xmlStrdup(value);
      exec->errString = pxVar7;
      exec->errStateNo = iVar1;
      exec->status = -1;
      uVar4 = 0xffffffff;
    }
  }
  return uVar4;
}

Assistant:

static int
xmlRegCompactPushString(xmlRegExecCtxtPtr exec,
	                xmlRegexpPtr comp,
	                const xmlChar *value,
	                void *data) {
    int state = exec->index;
    int i, target;

    if ((comp == NULL) || (comp->compact == NULL) || (comp->stringMap == NULL))
	return(-1);

    if (value == NULL) {
	/*
	 * are we at a final state ?
	 */
	if (comp->compact[state * (comp->nbstrings + 1)] ==
            XML_REGEXP_FINAL_STATE)
	    return(1);
	return(0);
    }

#ifdef DEBUG_PUSH
    printf("value pushed: %s\n", value);
#endif

    /*
     * Examine all outside transitions from current state
     */
    for (i = 0;i < comp->nbstrings;i++) {
	target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	if ((target > 0) && (target <= comp->nbstates)) {
	    target--; /* to avoid 0 */
	    if (xmlRegStrEqualWildcard(comp->stringMap[i], value)) {
		exec->index = target;
		if ((exec->callback != NULL) && (comp->transdata != NULL)) {
		    exec->callback(exec->data, value,
			  comp->transdata[state * comp->nbstrings + i], data);
		}
#ifdef DEBUG_PUSH
		printf("entering state %d\n", target);
#endif
		if (comp->compact[target * (comp->nbstrings + 1)] ==
		    XML_REGEXP_SINK_STATE)
		    goto error;

		if (comp->compact[target * (comp->nbstrings + 1)] ==
		    XML_REGEXP_FINAL_STATE)
		    return(1);
		return(0);
	    }
	}
    }
    /*
     * Failed to find an exit transition out from current state for the
     * current token
     */
#ifdef DEBUG_PUSH
    printf("failed to find a transition for %s on state %d\n", value, state);
#endif
error:
    if (exec->errString != NULL)
        xmlFree(exec->errString);
    exec->errString = xmlStrdup(value);
    exec->errStateNo = state;
    exec->status = -1;
#ifdef DEBUG_ERR
    testerr(exec);
#endif
    return(-1);
}